

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  void *__s2;
  uint in_ECX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  mz_uint32 *in_R8;
  bool bVar5;
  int ofs;
  char *pFile_comment;
  mz_uint file_comment_len;
  mz_uint file_extra_len;
  char *pFilename;
  mz_uint filename_len;
  mz_uint8 *pHeader;
  size_t comment_len;
  size_t name_len;
  mz_uint file_index;
  mz_uint i_1;
  mz_uint i;
  int local_118;
  int local_110;
  int local_10c;
  int local_104;
  ulong local_100;
  int local_f4;
  void *local_e0;
  uint local_d4;
  uint local_b4;
  undefined4 in_stack_ffffffffffffff58;
  mz_bool local_88;
  uint local_44;
  uint local_24;
  
  if (in_R8 != (mz_uint32 *)0x0) {
    *in_R8 = 0;
  }
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x68) == 0)) || (in_RSI == (char *)0x0)) {
    if (in_RDI != 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 0x18;
    }
    local_88 = 0;
  }
  else if ((((*(uint *)(*(long *)(in_RDI + 0x68) + 0x60) & 0x800) == 0) &&
           (*(int *)(in_RDI + 0x14) == 1)) &&
          (((in_ECX & 0x300) == 0 &&
           ((in_RDX == (char *)0x0 && (*(long *)(*(long *)(in_RDI + 0x68) + 0x48) != 0)))))) {
    local_88 = mz_zip_locate_file_binary_search
                         ((mz_zip_archive *)0x0,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),
                          in_R8);
  }
  else {
    sVar3 = strlen(in_RSI);
    if (sVar3 < 0x10000) {
      if (in_RDX == (char *)0x0) {
        local_100 = 0;
      }
      else {
        local_100 = strlen(in_RDX);
      }
      if (local_100 < 0x10000) {
        for (local_b4 = 0; local_b4 < *(uint *)(in_RDI + 0x10); local_b4 = local_b4 + 1) {
          lVar4 = **(long **)(in_RDI + 0x68) +
                  (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x20) + (ulong)local_b4 * 4)
          ;
          local_d4 = (uint)*(ushort *)(lVar4 + 0x1c);
          local_e0 = (void *)(lVar4 + 0x2e);
          if (sVar3 <= local_d4) {
            if (local_100 == 0) {
LAB_001342b9:
              if (((in_ECX & 0x200) != 0) && (local_d4 != 0)) {
                local_f4 = local_d4 - 1;
                do {
                  if (((*(char *)((long)local_e0 + (long)local_f4) == '/') ||
                      (*(char *)((long)local_e0 + (long)local_f4) == '\\')) ||
                     (*(char *)((long)local_e0 + (long)local_f4) == ':')) break;
                  local_f4 = local_f4 + -1;
                } while (-1 < local_f4);
                local_e0 = (void *)((long)local_e0 + (long)(local_f4 + 1));
                local_d4 = local_d4 - (local_f4 + 1);
              }
              if (local_d4 == sVar3) {
                if ((in_ECX & 0x100) == 0) {
                  for (local_44 = 0; local_44 < local_d4; local_44 = local_44 + 1) {
                    if ((in_RSI[local_44] < 'A') || ('Z' < in_RSI[local_44])) {
                      local_110 = (int)in_RSI[local_44];
                    }
                    else {
                      local_110 = in_RSI[local_44] + 0x20;
                    }
                    if ((*(char *)((long)local_e0 + (ulong)local_44) < 'A') ||
                       ('Z' < *(char *)((long)local_e0 + (ulong)local_44))) {
                      local_118 = (int)*(char *)((long)local_e0 + (ulong)local_44);
                    }
                    else {
                      local_118 = *(char *)((long)local_e0 + (ulong)local_44) + 0x20;
                    }
                    if (local_110 != local_118) {
                      bVar5 = false;
                      goto LAB_00134510;
                    }
                  }
                  bVar5 = true;
                }
                else {
                  iVar2 = memcmp(in_RSI,local_e0,(ulong)local_d4);
                  bVar5 = iVar2 == 0;
                }
LAB_00134510:
                if (bVar5) {
                  if (in_R8 != (mz_uint32 *)0x0) {
                    *in_R8 = local_b4;
                  }
                  return 1;
                }
              }
            }
            else {
              uVar1 = (uint)*(ushort *)(lVar4 + 0x20);
              __s2 = (void *)((long)local_e0 + (ulong)*(ushort *)(lVar4 + 0x1e) + (ulong)local_d4);
              if (uVar1 == local_100) {
                if ((in_ECX & 0x100) == 0) {
                  for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
                    if ((in_RDX[local_24] < 'A') || ('Z' < in_RDX[local_24])) {
                      local_104 = (int)in_RDX[local_24];
                    }
                    else {
                      local_104 = in_RDX[local_24] + 0x20;
                    }
                    if ((*(char *)((long)__s2 + (ulong)local_24) < 'A') ||
                       ('Z' < *(char *)((long)__s2 + (ulong)local_24))) {
                      local_10c = (int)*(char *)((long)__s2 + (ulong)local_24);
                    }
                    else {
                      local_10c = *(char *)((long)__s2 + (ulong)local_24) + 0x20;
                    }
                    if (local_104 != local_10c) {
                      bVar5 = false;
                      goto LAB_001342a8;
                    }
                  }
                  bVar5 = true;
                }
                else {
                  iVar2 = memcmp(in_RDX,__s2,(ulong)uVar1);
                  bVar5 = iVar2 == 0;
                }
LAB_001342a8:
                if (bVar5) goto LAB_001342b9;
              }
            }
          }
        }
        if (in_RDI != 0) {
          *(undefined4 *)(in_RDI + 0x1c) = 0x1c;
        }
        local_88 = 0;
      }
      else {
        if (in_RDI != 0) {
          *(undefined4 *)(in_RDI + 0x1c) = 0x18;
        }
        local_88 = 0;
      }
    }
    else {
      if (in_RDI != 0) {
        *(undefined4 *)(in_RDI + 0x1c) = 0x18;
      }
      local_88 = 0;
    }
  }
  return local_88;
}

Assistant:

inline mz_bool
mz_zip_reader_locate_file_v2(mz_zip_archive* pZip, const char* pName, const char* pComment, mz_uint flags,
                             mz_uint32* pIndex) {

    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0)
            && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)
            && ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment)
            && (pZip->m_pState->m_sorted_central_dir_offsets.m_size)) {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
        const mz_uint8* pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir,
                                                        mz_uint8,
                                                        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                                                             mz_uint32,
                                                                             file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char* pFilename = (const char*)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len) {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(
                    pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char* pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len)
                    || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
            int ofs = filename_len - 1;
            do {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags))) {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}